

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

EnumValueOptions * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateMessage<google::protobuf::EnumValueOptions>
          (Tables *this,EnumValueOptions *param_1)

{
  pointer *ppuVar1;
  iterator __position;
  EnumValueOptions *this_00;
  EnumValueOptions *result;
  _Head_base<0UL,_google::protobuf::Message_*,_false> local_18;
  
  this_00 = (EnumValueOptions *)operator_new(0x50);
  EnumValueOptions::EnumValueOptions(this_00);
  __position._M_current =
       (this->messages_).
       super__Vector_base<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>,_std::allocator<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_18._M_head_impl = (Message *)this_00;
  if (__position._M_current ==
      (this->messages_).
      super__Vector_base<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>,_std::allocator<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>,std::allocator<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>>>
    ::_M_realloc_insert<google::protobuf::EnumValueOptions*&>
              ((vector<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>,std::allocator<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>>>
                *)&this->messages_,__position,(EnumValueOptions **)&local_18);
  }
  else {
    ((__position._M_current)->_M_t).
    super___uniq_ptr_impl<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::Message_*,_std::default_delete<google::protobuf::Message>_>
    .super__Head_base<0UL,_google::protobuf::Message_*,_false>._M_head_impl = (Message *)this_00;
    ppuVar1 = &(this->messages_).
               super__Vector_base<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>,_std::allocator<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return (EnumValueOptions *)local_18._M_head_impl;
}

Assistant:

Type* DescriptorPool::Tables::AllocateMessage(Type* /* dummy */) {
  Type* result = new Type;
  messages_.emplace_back(result);
  return result;
}